

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_usable(REF_GEOM ref_geom,REF_INT geom,REF_BOOL *usable)

{
  double dVar1;
  double dVar2;
  REF_STATUS RVar3;
  uint uVar4;
  double local_340;
  double local_330;
  double local_320;
  double local_308;
  double local_300;
  double local_2f0;
  double local_2e0;
  double local_2c8;
  double local_2c0;
  double local_2b8;
  double local_2a8;
  double local_298;
  double local_280;
  double local_278;
  double local_268;
  double local_258;
  double local_248;
  double local_230;
  double local_228;
  double local_218;
  double local_210;
  double local_208;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL verbose;
  REF_DBL kmax;
  REF_DBL kmin;
  REF_DBL s [3];
  REF_DBL ks;
  REF_DBL r [3];
  REF_DBL kr;
  REF_DBL uv [2];
  REF_DBL drs [2];
  REF_DBL duv [2];
  REF_DBL duvdrs [4];
  REF_DBL drsduv [4];
  REF_DBL delta_radian;
  REF_DBL h;
  REF_DBL dxyz_dtuv [15];
  REF_DBL local_a8;
  REF_DBL xyz0 [3];
  REF_DBL uv0 [2];
  REF_DBL curvature_is_ok;
  REF_DBL s0 [3];
  REF_DBL ks0;
  REF_DBL r0 [3];
  REF_DBL kr0;
  REF_BOOL *usable_local;
  REF_INT geom_local;
  REF_GEOM ref_geom_local;
  
  *usable = 0;
  if ((geom < 0) || (ref_geom->max <= geom)) {
    return 3;
  }
  if (ref_geom->descr[geom * 6] == 2) {
    dVar1 = ref_geom->param[geom << 1];
    dVar2 = ref_geom->param[geom * 2 + 1];
    RVar3 = ref_egads_face_curvature(ref_geom,geom,r0 + 2,&ks0,s0 + 2,&curvature_is_ok);
    if (RVar3 != 0) {
      *usable = 0;
      return 0;
    }
    if (r0[2] <= 0.0) {
      local_208 = -r0[2];
    }
    else {
      local_208 = r0[2];
    }
    if (local_208 < 1.0) {
      if (s0[2] <= 0.0) {
        local_210 = -s0[2];
      }
      else {
        local_210 = s0[2];
      }
      if (local_210 < 1.0) {
        *usable = 1;
        return 0;
      }
    }
    uVar4 = ref_egads_eval(ref_geom,geom,&local_a8,&h);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x9ca,
             "ref_geom_usable",(ulong)uVar4,"eval edge");
      return uVar4;
    }
    duvdrs[3] = dxyz_dtuv[1] * r0[1] + h * ks0 + dxyz_dtuv[0] * r0[0];
    RVar3 = ref_matrix_inv_gen(2,duvdrs + 3,duv + 1);
    if (RVar3 != 0) {
      *usable = 0;
      return 0;
    }
    if (r0[2] <= 0.0) {
      local_218 = -r0[2];
    }
    else {
      local_218 = r0[2];
    }
    if (1.0 < local_218) {
      if (r0[2] <= 0.0) {
        local_228 = -r0[2];
      }
      else {
        local_228 = r0[2];
      }
      uv[1] = 0.1 / local_228;
      duv[0] = duvdrs[0] * uv[1] + duvdrs[2] * 0.0;
      kr = dVar1 + duv[1] * uv[1] + duvdrs[1] * 0.0;
      uv[0] = dVar2 + duv[0];
      RVar3 = ref_egads_face_curvature_at
                        (ref_geom,ref_geom->descr[geom * 6 + 1],ref_geom->descr[geom * 6 + 4],&kr,
                         r + 2,&ks,s + 2,&kmin);
      if (RVar3 != 0) {
        return 0;
      }
      if (r[2] <= 0.0) {
        local_230 = -r[2];
      }
      else {
        local_230 = r[2];
      }
      if (r0[2] <= 0.0) {
        local_248 = -r0[2];
      }
      else {
        local_248 = r0[2];
      }
      if (local_230 < local_248 * 0.1) {
LAB_0017bc1b:
        *usable = 0;
        return 0;
      }
      if (r0[2] <= 0.0) {
        local_258 = -r0[2];
      }
      else {
        local_258 = r0[2];
      }
      if (r[2] <= 0.0) {
        local_268 = -r[2];
      }
      else {
        local_268 = r[2];
      }
      if (local_258 * 10.0 < local_268) goto LAB_0017bc1b;
      if (r0[2] <= 0.0) {
        local_278 = -r0[2];
      }
      else {
        local_278 = r0[2];
      }
      uv[1] = -(0.1 / local_278);
      duv[0] = duvdrs[0] * uv[1] + duvdrs[2] * 0.0;
      kr = dVar1 + duv[1] * uv[1] + duvdrs[1] * 0.0;
      uv[0] = dVar2 + duv[0];
      RVar3 = ref_egads_face_curvature_at
                        (ref_geom,ref_geom->descr[geom * 6 + 1],ref_geom->descr[geom * 6 + 4],&kr,
                         r + 2,&ks,s + 2,&kmin);
      if (RVar3 != 0) {
        return 0;
      }
      if (r[2] <= 0.0) {
        local_280 = -r[2];
      }
      else {
        local_280 = r[2];
      }
      if (r0[2] <= 0.0) {
        local_298 = -r0[2];
      }
      else {
        local_298 = r0[2];
      }
      if (local_280 < local_298 * 0.1) {
LAB_0017bf8f:
        *usable = 0;
        return 0;
      }
      if (r0[2] <= 0.0) {
        local_2a8 = -r0[2];
      }
      else {
        local_2a8 = r0[2];
      }
      if (r[2] <= 0.0) {
        local_2b8 = -r[2];
      }
      else {
        local_2b8 = r[2];
      }
      if (local_2a8 * 10.0 < local_2b8) goto LAB_0017bf8f;
    }
    if (s0[2] <= 0.0) {
      local_2c0 = -s0[2];
    }
    else {
      local_2c0 = s0[2];
    }
    if (1.0 < local_2c0) {
      uv[1] = 0.0;
      duv[0] = duvdrs[0] * 0.0 + duvdrs[2] * (0.1 / s0[2]);
      kr = dVar1 + duv[1] * 0.0 + duvdrs[1] * (0.1 / s0[2]);
      uv[0] = dVar2 + duv[0];
      RVar3 = ref_egads_face_curvature_at
                        (ref_geom,ref_geom->descr[geom * 6 + 1],ref_geom->descr[geom * 6 + 4],&kr,
                         r + 2,&ks,s + 2,&kmin);
      if (RVar3 != 0) {
        return 0;
      }
      if (s[2] <= 0.0) {
        local_2c8 = -s[2];
      }
      else {
        local_2c8 = s[2];
      }
      if (s0[2] <= 0.0) {
        local_2e0 = -s0[2];
      }
      else {
        local_2e0 = s0[2];
      }
      if (local_2e0 * 0.1 <= local_2c8) {
        if (s0[2] <= 0.0) {
          local_2f0 = -s0[2];
        }
        else {
          local_2f0 = s0[2];
        }
        if (s[2] <= 0.0) {
          local_300 = -s[2];
        }
        else {
          local_300 = s[2];
        }
        if (local_300 <= local_2f0 * 10.0) {
          uv[1] = 0.0;
          duv[0] = duvdrs[0] * 0.0 + duvdrs[2] * -(0.1 / s0[2]);
          kr = dVar1 + duv[1] * 0.0 + duvdrs[1] * -(0.1 / s0[2]);
          uv[0] = dVar2 + duv[0];
          RVar3 = ref_egads_face_curvature_at
                            (ref_geom,ref_geom->descr[geom * 6 + 1],ref_geom->descr[geom * 6 + 4],
                             &kr,r + 2,&ks,s + 2,&kmin);
          if (RVar3 != 0) {
            return 0;
          }
          if (s[2] <= 0.0) {
            local_308 = -s[2];
          }
          else {
            local_308 = s[2];
          }
          if (s0[2] <= 0.0) {
            local_320 = -s0[2];
          }
          else {
            local_320 = s0[2];
          }
          if (local_320 * 0.1 <= local_308) {
            if (s0[2] <= 0.0) {
              local_330 = -s0[2];
            }
            else {
              local_330 = s0[2];
            }
            if (s[2] <= 0.0) {
              local_340 = -s[2];
            }
            else {
              local_340 = s[2];
            }
            if (local_340 <= local_330 * 10.0) goto LAB_0017c6a5;
          }
          *usable = 0;
          return 0;
        }
      }
      *usable = 0;
      return 0;
    }
  }
LAB_0017c6a5:
  *usable = 1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_usable(REF_GEOM ref_geom, REF_INT geom,
                                   REF_BOOL *usable) {
  REF_DBL kr0, r0[3], ks0, s0[3];
  REF_DBL curvature_is_ok = 1.0;
  REF_DBL uv0[2], xyz0[3], dxyz_dtuv[15];
  REF_DBL h, delta_radian = 0.1; /* 10 segment per radian of curvature */
  REF_DBL drsduv[4], duvdrs[4];
  REF_DBL duv[2], drs[2];
  REF_DBL uv[2];
  REF_DBL kr, r[3], ks, s[3];
  REF_DBL kmin = 0.1, kmax = 10.0;
  REF_BOOL verbose = REF_FALSE;
  *usable = REF_FALSE;
  if (geom < 0 || ref_geom_max(ref_geom) <= geom) return REF_INVALID;

  if (REF_GEOM_FACE == ref_geom_type(ref_geom, geom)) {
    uv0[0] = ref_geom_param(ref_geom, 0, geom); /* ignores periodic */
    uv0[1] = ref_geom_param(ref_geom, 1, geom);

    if (REF_SUCCESS !=
        ref_egads_face_curvature(ref_geom, geom, &kr0, r0, &ks0, s0)) {
      *usable = REF_FALSE;
      return REF_SUCCESS;
    }

    if (ABS(kr0) < curvature_is_ok && ABS(ks0) < curvature_is_ok) {
      *usable = REF_TRUE;
      return REF_SUCCESS;
    }

    RSS(ref_egads_eval(ref_geom, geom, xyz0, dxyz_dtuv), "eval edge");
    /* [x_u,y_u,z_u] [x_v,y_v,z_v] */
    /*  drsduv = [r s] * dxyz_dtuv */
    drsduv[0] =
        dxyz_dtuv[0] * r0[0] + dxyz_dtuv[1] * r0[1] + dxyz_dtuv[2] * r0[2];
    drsduv[1] =
        dxyz_dtuv[0] * s0[0] + dxyz_dtuv[1] * s0[1] + dxyz_dtuv[2] * s0[2];
    drsduv[2] =
        dxyz_dtuv[3] * r0[0] + dxyz_dtuv[4] * r0[1] + dxyz_dtuv[5] * r0[2];
    drsduv[3] =
        dxyz_dtuv[3] * s0[0] + dxyz_dtuv[4] * s0[1] + dxyz_dtuv[5] * s0[2];
    if (REF_SUCCESS != ref_matrix_inv_gen(2, drsduv, duvdrs)) {
      *usable = REF_FALSE;
      return REF_SUCCESS;
    }

    if (ABS(kr0) > curvature_is_ok) {
      /* find points +/- h from xyz0 along r */
      h = delta_radian / ABS(kr0);
      drs[0] = h;
      drs[1] = 0.0;
      duv[0] = duvdrs[0] * drs[0] + duvdrs[2] * drs[1];
      duv[1] = duvdrs[1] * drs[0] + duvdrs[3] * drs[1];
      uv[0] = uv0[0] + duv[0];
      uv[1] = uv0[1] + duv[1];
      if (REF_SUCCESS !=
          ref_egads_face_curvature_at(ref_geom, ref_geom_id(ref_geom, geom),
                                      ref_geom_degen(ref_geom, geom), uv, &kr,
                                      r, &ks, s))
        return REF_SUCCESS;
      if (ABS(kr) < kmin * ABS(kr0) || kmax * ABS(kr0) < ABS(kr)) {
        if (verbose) printf("kr0 %f kr+ %f\n", kr0, kr);
        *usable = REF_FALSE;
        return REF_SUCCESS;
      }
      h = delta_radian / ABS(kr0);
      drs[0] = -h;
      drs[1] = 0.0;
      duv[0] = duvdrs[0] * drs[0] + duvdrs[2] * drs[1];
      duv[1] = duvdrs[1] * drs[0] + duvdrs[3] * drs[1];
      uv[0] = uv0[0] + duv[0];
      uv[1] = uv0[1] + duv[1];
      if (REF_SUCCESS !=
          ref_egads_face_curvature_at(ref_geom, ref_geom_id(ref_geom, geom),
                                      ref_geom_degen(ref_geom, geom), uv, &kr,
                                      r, &ks, s))
        return REF_SUCCESS;
      if (ABS(kr) < kmin * ABS(kr0) || kmax * ABS(kr0) < ABS(kr)) {
        if (verbose) printf("kr0 %f kr- %f\n", kr0, kr);
        *usable = REF_FALSE;
        return REF_SUCCESS;
      }
    }
    if (ABS(ks0) > curvature_is_ok) {
      /* find points +/- h from xyz0 along s */
      h = delta_radian / ks0;
      drs[0] = 0.0;
      drs[1] = h;
      duv[0] = duvdrs[0] * drs[0] + duvdrs[2] * drs[1];
      duv[1] = duvdrs[1] * drs[0] + duvdrs[3] * drs[1];
      uv[0] = uv0[0] + duv[0];
      uv[1] = uv0[1] + duv[1];
      if (REF_SUCCESS !=
          ref_egads_face_curvature_at(ref_geom, ref_geom_id(ref_geom, geom),
                                      ref_geom_degen(ref_geom, geom), uv, &kr,
                                      r, &ks, s))
        return REF_SUCCESS;
      if (ABS(ks) < kmin * ABS(ks0) || kmax * ABS(ks0) < ABS(ks)) {
        if (verbose)
          printf("ks0 %f ks+ %f duv %f %f\n", ks0, ks, duv[0], duv[1]);
        *usable = REF_FALSE;
        return REF_SUCCESS;
      }
      if (verbose)
        printf("keep ks0 %f ks+ %f duv %f %f\n", ks0, ks, duv[0], duv[1]);
      h = delta_radian / ks0;
      drs[0] = 0.0;
      drs[1] = -h;
      duv[0] = duvdrs[0] * drs[0] + duvdrs[2] * drs[1];
      duv[1] = duvdrs[1] * drs[0] + duvdrs[3] * drs[1];
      uv[0] = uv0[0] + duv[0];
      uv[1] = uv0[1] + duv[1];
      if (REF_SUCCESS !=
          ref_egads_face_curvature_at(ref_geom, ref_geom_id(ref_geom, geom),
                                      ref_geom_degen(ref_geom, geom), uv, &kr,
                                      r, &ks, s))
        return REF_SUCCESS;
      if (ABS(ks) < kmin * ABS(ks0) || kmax * ABS(ks0) < ABS(ks)) {
        if (verbose)
          printf("ks0 %f ks- %f duv %f %f\n", ks0, ks, duv[0], duv[1]);
        *usable = REF_FALSE;
        return REF_SUCCESS;
      }
      if (verbose)
        printf("keep ks0 %f ks- %f duv %f %f\n", ks0, ks, duv[0], duv[1]);
    }
  }

  *usable = REF_TRUE;
  return REF_SUCCESS;
}